

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_half.h.c
# Opt level: O0

int test_half_from_float(cl_float f,cl_half ref,cl_half_rounding_mode mode,char *mode_str)

{
  cl_half cVar1;
  FI f_i;
  cl_half h;
  char *mode_str_local;
  cl_half_rounding_mode mode_local;
  uint uStack_c;
  cl_half ref_local;
  cl_float f_local;
  
  cVar1 = cl_half_from_float(f,mode);
  if (cVar1 != ref) {
    printf("\nERROR: converting 0x%08x to half (%s): expected 0x%04x, got 0x%04x\n",(ulong)(uint)f,
           mode_str,(ulong)ref,(ulong)cVar1);
  }
  uStack_c = (uint)(cVar1 == ref);
  return uStack_c;
}

Assistant:

int test_half_from_float(cl_float f, cl_half ref,
                         cl_half_rounding_mode mode, const char *mode_str)
{
  cl_half h = cl_half_from_float(f, mode);
  if (h != ref) {
    union FI f_i;
    f_i.f = f;
    printf(
      "\nERROR: converting 0x%08x to half (%s): expected 0x%04x, got 0x%04x\n",
      f_i.i, mode_str, ref, h);
    return 0;
  }
  return 1;
}